

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sink.hpp
# Opt level: O2

void __thiscall jsoncons::stream_sink<wchar_t>::~stream_sink(stream_sink<wchar_t> *this)

{
  std::wostream::write((wchar_t *)this->stream_ptr_,(long)this->begin_buffer_);
  std::wostream::flush();
  std::_Vector_base<wchar_t,_std::allocator<wchar_t>_>::~_Vector_base
            (&(this->buffer_).super__Vector_base<wchar_t,_std::allocator<wchar_t>_>);
  return;
}

Assistant:

~stream_sink() noexcept
        {
            stream_ptr_->write(begin_buffer_, buffer_length());
            stream_ptr_->flush();
        }